

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Tags.cpp
# Opt level: O2

void RenX::replace_tag(string *fmt,string_view tag,string_view internal_tag)

{
  string_view tag_00;
  string_view internal_tag_00;
  _If_sv<std::basic_string_view<char>,_size_type> __pos;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = internal_tag._M_str;
  local_20._M_len = internal_tag._M_len;
  local_30._M_str = tag._M_str;
  local_30._M_len = tag._M_len;
  __pos = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)fmt,&local_30,0);
  if (__pos != 0xffffffffffffffff) {
    std::__cxx11::string::replace<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)fmt,__pos,local_30._M_len,&local_20);
    tag_00._M_str = local_30._M_str;
    tag_00._M_len = local_30._M_len;
    internal_tag_00._M_str = local_20._M_str;
    internal_tag_00._M_len = local_20._M_len;
    replace_tag(fmt,tag_00,internal_tag_00);
  }
  return;
}

Assistant:

void RenX::replace_tag(std::string& fmt, std::string_view tag, std::string_view internal_tag) {
	// Search for tag
	size_t tag_pos = fmt.find(tag);
	if (tag_pos == std::string::npos) {
		return;
	}

	// Replace the tag
	fmt.replace(tag_pos, tag.size(), internal_tag);

	// Recurse for any further instances; less efficient than old replace() but should be rare anyways
	replace_tag(fmt, tag, internal_tag);
}